

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O0

int gmlc::utilities::string_viewOps::trailingStringInt(string_view input,int defNum)

{
  string_view input_00;
  string_view input_01;
  string_view input_02;
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  size_type sVar4;
  basic_string_view<char,_std::char_traits<char>_> *this;
  int in_EDX;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  size_t length;
  size_type pos1;
  size_type in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  undefined1 *local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  int local_4;
  
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_18);
  local_4 = in_EDX;
  if (((!bVar1) &&
      (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back(&local_18),
      '/' < *pvVar3)) &&
     (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back(&local_18), *pvVar3 < ':'
     )) {
    bVar5._M_str = in_stack_ffffffffffffffa0;
    bVar5._M_len = in_stack_ffffffffffffff98;
    local_28 = (undefined1 *)
               std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                         (in_stack_ffffffffffffff90,bVar5,in_stack_ffffffffffffff88);
    if (local_28 == (undefined1 *)0xffffffffffffffff) {
      sVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
      if (sVar4 < 0xb) {
        input_00._M_str = in_stack_ffffffffffffffb0;
        input_00._M_len = in_stack_ffffffffffffffa8;
        iVar2 = toIntSimple(input_00);
        return iVar2;
      }
      sVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::length
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
      local_28 = (undefined1 *)(sVar4 - 10);
    }
    this = (basic_string_view<char,_std::char_traits<char>_> *)
           CLI::std::basic_string_view<char,_std::char_traits<char>_>::length
                     ((basic_string_view<char,_std::char_traits<char>_> *)&local_18);
    if (local_28 == (undefined1 *)((long)&this[-1]._M_str + 6)) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::back(&local_18);
      local_4 = *pvVar3 + -0x30;
    }
    else if ((this < (basic_string_view<char,_std::char_traits<char>_> *)0xb) ||
            ((undefined1 *)((long)&this[-1]._M_len + 6) <= local_28)) {
      bVar5 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (this,in_stack_ffffffffffffffa8,(size_type)in_stack_ffffffffffffffa0);
      input_01._M_str = (char *)this;
      input_01._M_len = (size_t)bVar5._M_str;
      local_4 = toIntSimple(input_01);
    }
    else {
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                (this,in_stack_ffffffffffffffa8,(size_type)in_stack_ffffffffffffffa0);
      input_02._M_str = (char *)this;
      input_02._M_len = in_stack_ffffffffffffffa8;
      local_4 = toIntSimple(input_02);
    }
  }
  return local_4;
}

Assistant:

int trailingStringInt(std::string_view input, int defNum)
{
    if (input.empty() || (input.back() < '0' || input.back() > '9')) {
        return defNum;
    }

    auto pos1 = input.find_last_not_of(digits);
    if (pos1 == std::string_view::npos)  // in case the whole thing is a number
    {
        if (input.length() <= 10) {
            return toIntSimple(input);
        }
        pos1 = input.length() - 10;
    }
    size_t length = input.length();
    if (pos1 == length - 2) {
        return input.back() - '0';
    }
    if ((length <= 10) || (pos1 >= length - 10)) {
        return toIntSimple(input.substr(pos1 + 1));
    }
    return toIntSimple(input.substr(length - 9));
}